

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall argo::json::operator<(json *this,json *other)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  json_exception *this_00;
  char *first_json_type_name;
  char *second_json_type_name;
  double dVar4;
  double dVar5;
  string local_60 [32];
  string local_40 [32];
  json *local_20;
  json *other_local;
  json *this_local;
  
  local_20 = other;
  other_local = this;
  if ((this->m_type == string_e) && (other->m_type == string_e)) {
    psVar3 = operator_cast_to_string_(this);
    std::__cxx11::string::string(local_40,(string *)psVar3);
    psVar3 = operator_cast_to_string_(local_20);
    std::__cxx11::string::string(local_60,(string *)psVar3);
    this_local._7_1_ =
         std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  else if ((this->m_type == number_int_e) && (other->m_type == number_int_e)) {
    iVar1 = operator_cast_to_int(this);
    iVar2 = operator_cast_to_int(local_20);
    this_local._7_1_ = iVar1 < iVar2;
  }
  else {
    if ((((this->m_type != number_double_e) || (other->m_type != number_double_e)) &&
        ((this->m_type != number_double_e || (other->m_type != number_int_e)))) &&
       ((this->m_type != number_int_e || (other->m_type != number_double_e)))) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      first_json_type_name = get_instance_type_name(this);
      second_json_type_name = get_instance_type_name(local_20);
      json_exception::json_exception
                (this_00,types_not_comparable_e,first_json_type_name,second_json_type_name);
      __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
    }
    dVar4 = operator_cast_to_double(this);
    dVar5 = operator_cast_to_double(local_20);
    this_local._7_1_ = dVar4 < dVar5;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool json::operator<(const json &other) const
{
    if (m_type == string_e && other.m_type == string_e)
    {
        return static_cast<string>(*this) < static_cast<string>(other);
    }
    else if (m_type == number_int_e && other.m_type == number_int_e)
    {
        return static_cast<int>(*this) < static_cast<int>(other);
    }
    else if ((m_type == number_double_e && other.m_type == number_double_e) ||
             (m_type == number_double_e && other.m_type == number_int_e) ||
             (m_type == number_int_e && other.m_type == number_double_e))
    {
        return static_cast<double>(*this) < static_cast<double>(other);
    }
    else
    {
        throw json_exception(
                        json_exception::types_not_comparable_e,
                        get_instance_type_name(),
                        other.get_instance_type_name());
    }
}